

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alcmain.h
# Opt level: O3

void __thiscall DistanceComp::setSampleCount(DistanceComp *this,size_t new_size)

{
  ulong uVar1;
  FlexArray<float,_16UL> *ptr;
  FlexArray<float,_16UL> *pFVar2;
  size_t size;
  
  uVar1 = new_size * 4 + 0x10;
  size = 0x20;
  if (0x20 < uVar1) {
    size = uVar1;
  }
  pFVar2 = (FlexArray<float,_16UL> *)al_calloc(0x10,size);
  if (pFVar2 != (FlexArray<float,_16UL> *)0x0) {
    pFVar2->mSize = new_size;
  }
  ptr = (this->mSamples)._M_t.
        super___uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
        .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl;
  (this->mSamples)._M_t.
  super___uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl = pFVar2;
  if (ptr != (FlexArray<float,_16UL> *)0x0) {
    al_free(ptr);
    return;
  }
  return;
}

Assistant:

void setSampleCount(size_t new_size)
    { mSamples = FloatArray::Create(new_size); }